

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_haiku.c
# Opt level: O1

Sprite * make_flair(int image,float x,float y,float end_time)

{
  Flair *pFVar1;
  long lVar2;
  
  pFVar1 = (Flair *)malloc(0x180);
  (pFVar1->sprite).image = image;
  (pFVar1->sprite).x = x;
  (pFVar1->sprite).y = y;
  (pFVar1->sprite).scale_x = 1.0;
  (pFVar1->sprite).align_x = 0.5;
  (pFVar1->sprite).g = 1.0;
  (pFVar1->sprite).b = 1.0;
  (pFVar1->sprite).scale_y = 1.0;
  (pFVar1->sprite).align_y = 0.5;
  (pFVar1->sprite).angle = 0.0;
  (pFVar1->sprite).r = 1.0;
  (pFVar1->sprite).opacity = 1.0;
  lVar2 = 0x40;
  do {
    *(undefined8 *)((long)((pFVar1->sprite).anims + -2) + lVar2) = 0;
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0x180);
  pFVar1->end_time = end_time;
  pFVar1->next = flairs;
  flairs = pFVar1;
  return &pFVar1->sprite;
}

Assistant:

static Sprite *make_flair(int image, float x, float y, float end_time)
{
   Flair *fl = malloc(sizeof *fl);
   init_sprite(&fl->sprite, image, x, y, 1.0, 1.0);
   fl->end_time = end_time;
   fl->next = flairs;
   flairs = fl;
   return &fl->sprite;
}